

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImFormatStringV(char *buf,size_t buf_size,char *fmt,__va_list_tag *args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  iVar1 = __vsnprintf_chk(buf,buf_size,1,0xffffffffffffffff,fmt,args);
  if (buf != (char *)0x0) {
    iVar2 = (int)buf_size + -1;
    iVar3 = iVar2;
    if (iVar1 < (int)buf_size) {
      iVar3 = iVar1;
    }
    bVar4 = iVar1 == -1;
    iVar1 = iVar3;
    if (bVar4) {
      iVar1 = iVar2;
    }
    buf[iVar1] = '\0';
  }
  return iVar1;
}

Assistant:

int ImFormatStringV(char* buf, size_t buf_size, const char* fmt, va_list args)
{
#ifdef IMGUI_USE_STB_SPRINTF
    int w = stbsp_vsnprintf(buf, (int)buf_size, fmt, args);
#else
    int w = vsnprintf(buf, buf_size, fmt, args);
#endif
    if (buf == NULL)
        return w;
    if (w == -1 || w >= (int)buf_size)
        w = (int)buf_size - 1;
    buf[w] = 0;
    return w;
}